

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::~SocketWriter(SocketWriter *this)

{
  ~SocketWriter(this);
  operator_delete(this);
  return;
}

Assistant:

~SocketWriter() override {
      if (sockfd_ != -1)
        CloseConnection();
    }